

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O1

void server::forgive_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint cn;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  clientinfo *ci;
  clientinfo *ci_00;
  char *pcVar5;
  string forgivemsg;
  stringformatter local_140;
  char local_138 [272];
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    cn = atoi(args[1]);
    if (1000 < cn) {
      iVar2 = QServ::getSender(&qs);
      pcVar4 = QServ::getCommandDesc(&qs,cid);
      goto LAB_00156204;
    }
  }
  else {
    cn = QServ::getSender(&qs);
  }
  ci = QServ::getClient(&qs,cn);
  if (ci != (clientinfo *)0x0) {
    if (ci->connected == true) {
      iVar2 = QServ::getSender(&qs);
      ci_00 = QServ::getClient(&qs,iVar2);
      uVar3 = QServ::getSender(&qs);
      if ((((cn < 0x3e9) && (cn != uVar3)) && (ci->connected == true)) && (args[1] != (char *)0x0))
      {
        if ((ci->state).teamkills < 1) {
          local_140.buf = local_138;
          pcVar4 = colorname(ci);
          stringformatter::operator()
                    (&local_140,"\f3Error: %s has not teamkilled anyone yet",pcVar4);
        }
        else {
          local_140.buf = local_138;
          pcVar4 = colorname(ci_00);
          pcVar5 = colorname(ci);
          stringformatter::operator()(&local_140,"\f0%s \f7has forgiven \f3%s",pcVar4,pcVar5);
        }
        sendf(-1,1,"ris",0x23,local_138);
      }
    }
    return;
  }
  iVar2 = QServ::getSender(&qs);
  pcVar4 = "\f3Error: Player not connected";
LAB_00156204:
  sendf(iVar2,1,"ris",0x23,pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK forgive_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    forgiveprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            clientinfo *self = qs.getClient(CMD_SENDER);
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                if(ci->state.teamkills >= 1) {
                                    defformatstring(forgivemsg)("\f0%s \f7has forgiven \f3%s", colorname(self), colorname(ci));
                                    sendf(-1, 1, "ris", N_SERVMSG, forgivemsg);
                                }
                                else {
                                    defformatstring(nk)("\f3Error: %s has not teamkilled anyone yet", colorname(ci));
                                    sendf(-1, 1, "ris", N_SERVMSG, nk);
                                }
                            }
                            
                       }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto forgiveprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }